

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O1

optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> * __thiscall
wasm::WATParser::anon_unknown_10::num
          (optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *__return_storage_ptr__,
          anon_unknown_10 *this,string_view in,OverflowBehavior overflow)

{
  bool bVar1;
  size_t sVar2;
  anon_unknown_10 *extraout_RDX;
  undefined1 auVar3 [8];
  anon_unknown_10 *paVar5;
  bool bVar6;
  string_view sv;
  undefined1 local_78 [8];
  LexIntCtx ctx;
  uint64_t local_48;
  char *local_40;
  Sign local_34;
  char *pcVar4;
  
  ctx.super_LexCtx.input._M_len = in._M_len;
  ctx._36_4_ = in._M_str._0_4_;
  ctx.super_LexCtx.input._M_str = (char *)0x0;
  ctx.super_LexCtx.lexedSize._0_5_ = 0;
  ctx.super_LexCtx.lexedSize._5_3_ = 0;
  ctx.n._0_4_ = NoSign;
  ctx.n._4_1_ = '\0';
  if ((this == (anon_unknown_10 *)0x0) ||
     (local_78 = (undefined1  [8])this, bVar1 = LexIntCtx::takeDigit((LexIntCtx *)local_78), !bVar1)
     ) {
    (__return_storage_ptr__->
    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>).
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
    _M_engaged = false;
    return __return_storage_ptr__;
  }
  local_40 = (__return_storage_ptr__->
             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>)
             ._M_payload.
             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
             _M_payload._M_value.super_LexResult.span._M_str;
  local_48 = (__return_storage_ptr__->
             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>)
             ._M_payload.
             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
             _M_payload._M_value.n;
  local_34 = (__return_storage_ptr__->
             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>)
             ._M_payload.
             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
             _M_payload._M_value.sign;
  paVar5 = (anon_unknown_10 *)
           (__return_storage_ptr__->
           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>).
           _M_payload.
           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
           _M_payload._M_value.super_LexResult.span._M_len;
  do {
    do {
      sv._M_str = "_";
      sv._M_len = 1;
      pcVar4 = (char *)0x1;
      sVar2 = LexCtx::startsWith((LexCtx *)local_78,sv);
      if (sVar2 != 0) {
        ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
      }
      bVar1 = LexIntCtx::takeDigit((LexIntCtx *)local_78);
    } while (bVar1);
    if (sVar2 == 0) {
      if (ctx._36_4_ == 0) {
        if (ctx.n._4_1_ == '\0') {
          auVar3 = (undefined1  [8])extraout_RDX;
          if ((ctx.super_LexCtx.input._M_str != (char *)0x0) &&
             (auVar3 = local_78, pcVar4 = (char *)ctx.super_LexCtx.input._M_len,
             ctx.super_LexCtx.input._M_str <= (ulong)local_78)) {
            auVar3 = (undefined1  [8])ctx.super_LexCtx.input._M_str;
          }
          if (ctx.super_LexCtx.input._M_str != (char *)0x0) {
            local_34 = (Sign)ctx.n;
            local_48 = -CONCAT35(ctx.super_LexCtx.lexedSize._5_3_,
                                 (undefined5)ctx.super_LexCtx.lexedSize);
            if ((Sign)ctx.n != Neg) {
              local_48 = CONCAT35(ctx.super_LexCtx.lexedSize._5_3_,
                                  (undefined5)ctx.super_LexCtx.lexedSize);
            }
            bVar6 = true;
            local_40 = pcVar4;
            goto LAB_009f2ad1;
          }
        }
        goto LAB_009f2a96;
      }
      auVar3 = (undefined1  [8])paVar5;
      if (ctx.super_LexCtx.input._M_str != (char *)0x0) {
        local_40 = (char *)ctx.super_LexCtx.input._M_len;
        auVar3 = local_78;
        if (ctx.super_LexCtx.input._M_str <= (ulong)local_78) {
          auVar3 = (undefined1  [8])ctx.super_LexCtx.input._M_str;
        }
        local_48 = 0;
        local_34 = NoSign;
      }
      bVar6 = ctx.super_LexCtx.input._M_str != (char *)0x0;
    }
    else {
LAB_009f2a96:
      bVar6 = false;
      auVar3 = (undefined1  [8])paVar5;
    }
LAB_009f2ad1:
    paVar5 = (anon_unknown_10 *)auVar3;
    if (!bVar1) {
      (__return_storage_ptr__->
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>).
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
      _M_engaged = bVar6;
      (__return_storage_ptr__->
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>).
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
      _M_payload._M_value.super_LexResult.span._M_str = local_40;
      (__return_storage_ptr__->
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>).
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
      _M_payload._M_value.n = local_48;
      (__return_storage_ptr__->
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>).
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
      _M_payload._M_value.sign = local_34;
      (__return_storage_ptr__->
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>).
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
      _M_payload._M_value.super_LexResult.span._M_len = (size_t)auVar3;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::optional<LexIntResult> num(std::string_view in,
                                OverflowBehavior overflow = DisallowOverflow) {
  LexIntCtx ctx(in);
  if (ctx.empty()) {
    return {};
  }
  if (!ctx.takeDigit()) {
    return {};
  }
  while (true) {
    bool under = ctx.takePrefix("_"sv);
    if (!ctx.takeDigit()) {
      if (!under) {
        return overflow == DisallowOverflow ? ctx.lexed() : ctx.lexedRaw();
      }
      // TODO: Add error production for trailing underscore.
      return {};
    }
  }
}